

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclDnsize.c
# Opt level: O3

int Abc_SclCheckImprovement
              (SC_Man *p,Abc_Obj_t *pObj,Vec_Int_t *vNodes,Vec_Int_t *vEvals,int Notches,
              int DelayGap)

{
  uint uVar1;
  float fVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  undefined4 uVar6;
  Vec_Int_t *pVVar7;
  void *pvVar8;
  Vec_Ptr_t *pVVar9;
  Vec_Flt_t *pVVar10;
  SC_Pair *pSVar11;
  int *piVar12;
  void **ppvVar13;
  long *plVar14;
  long lVar15;
  int iVar16;
  float *pfVar17;
  Abc_Ntk_t *pAVar18;
  uint uVar19;
  long lVar20;
  uint uVar21;
  ulong uVar22;
  SC_Cell *pSVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  timespec ts;
  float local_74;
  SC_Cell *local_70;
  uint local_64;
  long local_48;
  timespec local_40;
  
  iVar16 = clock_gettime(3,&local_40);
  if (iVar16 < 0) {
    local_48 = 1;
  }
  else {
    lVar20 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    local_48 = ((lVar20 >> 7) - (lVar20 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  iVar16 = pObj->Id;
  if ((long)iVar16 < 0) {
LAB_00431efd:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  pVVar7 = pObj->pNtk->vGates;
  if (pVVar7->nSize <= iVar16) goto LAB_00431efd;
  uVar19 = pVVar7->pArray[iVar16];
  if ((ulong)uVar19 == 0xffffffff) {
    local_70 = (SC_Cell *)0x0;
  }
  else {
    if (((int)uVar19 < 0) ||
       (pvVar8 = pObj->pNtk->pSCLib, *(int *)((long)pvVar8 + 100) <= (int)uVar19))
    goto LAB_00431e81;
    local_70 = *(SC_Cell **)(*(long *)((long)pvVar8 + 0x68) + (ulong)uVar19 * 8);
  }
  p->vTimes2->nSize = 0;
  iVar16 = vNodes->nSize;
  if (0 < iVar16) {
    lVar20 = 0;
    do {
      iVar3 = vNodes->pArray[lVar20];
      if (((long)iVar3 < 0) || (pVVar9 = p->pNtk->vObjs, pVVar9->nSize <= iVar3)) goto LAB_00431e81;
      pvVar8 = pVVar9->pArray[iVar3];
      if (pvVar8 != (void *)0x0) {
        pVVar10 = p->vTimes2;
        fVar24 = p->pTimes[*(uint *)((long)pvVar8 + 0x10)].rise;
        uVar19 = pVVar10->nSize;
        if (uVar19 == pVVar10->nCap) {
          if ((int)uVar19 < 0x10) {
            if (pVVar10->pArray == (float *)0x0) {
              pfVar17 = (float *)malloc(0x40);
            }
            else {
              pfVar17 = (float *)realloc(pVVar10->pArray,0x40);
            }
            pVVar10->pArray = pfVar17;
            pVVar10->nCap = 0x10;
          }
          else {
            if (pVVar10->pArray == (float *)0x0) {
              pfVar17 = (float *)malloc((ulong)uVar19 * 8);
            }
            else {
              pfVar17 = (float *)realloc(pVVar10->pArray,(ulong)uVar19 * 8);
            }
            pVVar10->pArray = pfVar17;
            pVVar10->nCap = uVar19 * 2;
          }
        }
        else {
          pfVar17 = pVVar10->pArray;
        }
        iVar16 = pVVar10->nSize;
        pVVar10->nSize = iVar16 + 1;
        pfVar17[iVar16] = fVar24;
        pVVar10 = p->vTimes2;
        fVar24 = p->pTimes[*(uint *)((long)pvVar8 + 0x10)].fall;
        uVar19 = pVVar10->nSize;
        if (uVar19 == pVVar10->nCap) {
          if ((int)uVar19 < 0x10) {
            if (pVVar10->pArray == (float *)0x0) {
              pfVar17 = (float *)malloc(0x40);
            }
            else {
              pfVar17 = (float *)realloc(pVVar10->pArray,0x40);
            }
            pVVar10->pArray = pfVar17;
            pVVar10->nCap = 0x10;
          }
          else {
            if (pVVar10->pArray == (float *)0x0) {
              pfVar17 = (float *)malloc((ulong)uVar19 * 8);
            }
            else {
              pfVar17 = (float *)realloc(pVVar10->pArray,(ulong)uVar19 * 8);
            }
            pVVar10->pArray = pfVar17;
            pVVar10->nCap = uVar19 * 2;
          }
        }
        else {
          pfVar17 = pVVar10->pArray;
        }
        iVar16 = pVVar10->nSize;
        pVVar10->nSize = iVar16 + 1;
        pfVar17[iVar16] = fVar24;
        pVVar10 = p->vTimes2;
        fVar24 = p->pSlews[*(uint *)((long)pvVar8 + 0x10)].rise;
        uVar19 = pVVar10->nSize;
        if (uVar19 == pVVar10->nCap) {
          if ((int)uVar19 < 0x10) {
            if (pVVar10->pArray == (float *)0x0) {
              pfVar17 = (float *)malloc(0x40);
            }
            else {
              pfVar17 = (float *)realloc(pVVar10->pArray,0x40);
            }
            pVVar10->pArray = pfVar17;
            pVVar10->nCap = 0x10;
          }
          else {
            if (pVVar10->pArray == (float *)0x0) {
              pfVar17 = (float *)malloc((ulong)uVar19 * 8);
            }
            else {
              pfVar17 = (float *)realloc(pVVar10->pArray,(ulong)uVar19 * 8);
            }
            pVVar10->pArray = pfVar17;
            pVVar10->nCap = uVar19 * 2;
          }
        }
        else {
          pfVar17 = pVVar10->pArray;
        }
        iVar16 = pVVar10->nSize;
        pVVar10->nSize = iVar16 + 1;
        pfVar17[iVar16] = fVar24;
        pVVar10 = p->vTimes2;
        fVar24 = p->pSlews[*(uint *)((long)pvVar8 + 0x10)].fall;
        uVar19 = pVVar10->nSize;
        if (uVar19 == pVVar10->nCap) {
          if ((int)uVar19 < 0x10) {
            if (pVVar10->pArray == (float *)0x0) {
              pfVar17 = (float *)malloc(0x40);
            }
            else {
              pfVar17 = (float *)realloc(pVVar10->pArray,0x40);
            }
            pVVar10->pArray = pfVar17;
            pVVar10->nCap = 0x10;
          }
          else {
            if (pVVar10->pArray == (float *)0x0) {
              pfVar17 = (float *)malloc((ulong)uVar19 * 8);
            }
            else {
              pfVar17 = (float *)realloc(pVVar10->pArray,(ulong)uVar19 * 8);
            }
            pVVar10->pArray = pfVar17;
            pVVar10->nCap = uVar19 * 2;
          }
        }
        else {
          pfVar17 = pVVar10->pArray;
        }
        iVar16 = pVVar10->nSize;
        pVVar10->nSize = iVar16 + 1;
        pfVar17[iVar16] = fVar24;
        iVar16 = vNodes->nSize;
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 < iVar16);
  }
  p->vTimes3->nSize = 0;
  iVar16 = vEvals->nSize;
  if (0 < iVar16) {
    lVar20 = 0;
    do {
      iVar3 = vEvals->pArray[lVar20];
      if (((long)iVar3 < 0) || (pVVar9 = p->pNtk->vObjs, pVVar9->nSize <= iVar3)) goto LAB_00431e81;
      pvVar8 = pVVar9->pArray[iVar3];
      if (pvVar8 != (void *)0x0) {
        pVVar10 = p->vTimes3;
        fVar24 = p->pTimes[*(uint *)((long)pvVar8 + 0x10)].rise;
        uVar19 = pVVar10->nSize;
        if (uVar19 == pVVar10->nCap) {
          if ((int)uVar19 < 0x10) {
            if (pVVar10->pArray == (float *)0x0) {
              pfVar17 = (float *)malloc(0x40);
            }
            else {
              pfVar17 = (float *)realloc(pVVar10->pArray,0x40);
            }
            pVVar10->pArray = pfVar17;
            pVVar10->nCap = 0x10;
          }
          else {
            if (pVVar10->pArray == (float *)0x0) {
              pfVar17 = (float *)malloc((ulong)uVar19 * 8);
            }
            else {
              pfVar17 = (float *)realloc(pVVar10->pArray,(ulong)uVar19 * 8);
            }
            pVVar10->pArray = pfVar17;
            pVVar10->nCap = uVar19 * 2;
          }
        }
        else {
          pfVar17 = pVVar10->pArray;
        }
        iVar16 = pVVar10->nSize;
        pVVar10->nSize = iVar16 + 1;
        pfVar17[iVar16] = fVar24;
        pVVar10 = p->vTimes3;
        fVar24 = p->pTimes[*(uint *)((long)pvVar8 + 0x10)].fall;
        uVar19 = pVVar10->nSize;
        if (uVar19 == pVVar10->nCap) {
          if ((int)uVar19 < 0x10) {
            if (pVVar10->pArray == (float *)0x0) {
              pfVar17 = (float *)malloc(0x40);
            }
            else {
              pfVar17 = (float *)realloc(pVVar10->pArray,0x40);
            }
            pVVar10->pArray = pfVar17;
            pVVar10->nCap = 0x10;
          }
          else {
            if (pVVar10->pArray == (float *)0x0) {
              pfVar17 = (float *)malloc((ulong)uVar19 * 8);
            }
            else {
              pfVar17 = (float *)realloc(pVVar10->pArray,(ulong)uVar19 * 8);
            }
            pVVar10->pArray = pfVar17;
            pVVar10->nCap = uVar19 * 2;
          }
        }
        else {
          pfVar17 = pVVar10->pArray;
        }
        iVar16 = pVVar10->nSize;
        pVVar10->nSize = iVar16 + 1;
        pfVar17[iVar16] = fVar24;
        iVar16 = vEvals->nSize;
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 < iVar16);
  }
  p->vLoads2->nSize = 0;
  if (0 < (pObj->vFanins).nSize) {
    lVar20 = 0;
    do {
      pvVar8 = pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar20]];
      pVVar10 = p->vLoads2;
      fVar24 = p->pLoads[*(uint *)((long)pvVar8 + 0x10)].rise;
      uVar19 = pVVar10->nSize;
      if (uVar19 == pVVar10->nCap) {
        if ((int)uVar19 < 0x10) {
          if (pVVar10->pArray == (float *)0x0) {
            pfVar17 = (float *)malloc(0x40);
          }
          else {
            pfVar17 = (float *)realloc(pVVar10->pArray,0x40);
          }
          pVVar10->pArray = pfVar17;
          pVVar10->nCap = 0x10;
        }
        else {
          if (pVVar10->pArray == (float *)0x0) {
            pfVar17 = (float *)malloc((ulong)uVar19 * 8);
          }
          else {
            pfVar17 = (float *)realloc(pVVar10->pArray,(ulong)uVar19 * 8);
          }
          pVVar10->pArray = pfVar17;
          pVVar10->nCap = uVar19 * 2;
        }
      }
      else {
        pfVar17 = pVVar10->pArray;
      }
      iVar16 = pVVar10->nSize;
      pVVar10->nSize = iVar16 + 1;
      pfVar17[iVar16] = fVar24;
      pVVar10 = p->vLoads2;
      fVar24 = p->pLoads[*(uint *)((long)pvVar8 + 0x10)].fall;
      uVar19 = pVVar10->nSize;
      if (uVar19 == pVVar10->nCap) {
        if ((int)uVar19 < 0x10) {
          if (pVVar10->pArray == (float *)0x0) {
            pfVar17 = (float *)malloc(0x40);
          }
          else {
            pfVar17 = (float *)realloc(pVVar10->pArray,0x40);
          }
          pVVar10->pArray = pfVar17;
          pVVar10->nCap = 0x10;
        }
        else {
          if (pVVar10->pArray == (float *)0x0) {
            pfVar17 = (float *)malloc((ulong)uVar19 * 8);
          }
          else {
            pfVar17 = (float *)realloc(pVVar10->pArray,(ulong)uVar19 * 8);
          }
          pVVar10->pArray = pfVar17;
          pVVar10->nCap = uVar19 * 2;
        }
      }
      else {
        pfVar17 = pVVar10->pArray;
      }
      iVar16 = pVVar10->nSize;
      pVVar10->nSize = iVar16 + 1;
      pfVar17[iVar16] = fVar24;
      lVar20 = lVar20 + 1;
    } while (lVar20 < (pObj->vFanins).nSize);
  }
  local_74 = (float)-DelayGap;
  iVar16 = 0;
  local_64 = 0xffffffff;
  pSVar23 = local_70;
  do {
    if (pSVar23->area < local_70->area) {
      pAVar18 = pObj->pNtk;
      if (Notches < iVar16) goto LAB_00431bac;
      iVar3 = pObj->Id;
      if (((long)iVar3 < 0) || (pAVar18->vGates->nSize <= iVar3)) goto LAB_00431ea0;
      pAVar18->vGates->pArray[iVar3] = pSVar23->Id;
      Abc_SclUpdateLoad(p,pObj,local_70,pSVar23);
      Abc_SclTimeCone(p,vNodes);
      iVar3 = pObj->Id;
      if ((long)iVar3 < 0) goto LAB_00431ea0;
      pAVar18 = pObj->pNtk;
      pVVar7 = pAVar18->vGates;
      if (pVVar7->nSize <= iVar3) goto LAB_00431ea0;
      pVVar7->pArray[iVar3] = local_70->Id;
      lVar20 = (long)(pObj->vFanins).nSize;
      pVVar10 = p->vLoads2;
      uVar19 = pVVar10->nSize;
      if (lVar20 < 1) {
        uVar22 = 0;
      }
      else {
        uVar21 = 0;
        if (0 < (int)uVar19) {
          uVar21 = uVar19;
        }
        uVar22 = 0;
        do {
          if ((uVar21 + 1 & 0xfffffffe) == uVar22) goto LAB_00431e62;
          pfVar17 = pVVar10->pArray;
          pSVar11 = p->pLoads;
          uVar4 = *(uint *)((long)pAVar18->vObjs->pArray
                                  [*(int *)((long)(pObj->vFanins).pArray + uVar22 * 2)] + 0x10);
          pSVar11[uVar4].rise = pfVar17[uVar22];
          if ((uVar19 & 0xfffffffe) == uVar22) goto LAB_00431e62;
          lVar15 = uVar22 + 1;
          uVar22 = uVar22 + 2;
          pSVar11[uVar4].fall = pfVar17[lVar15];
        } while (lVar20 * 2 != uVar22);
      }
      if (uVar19 != (uint)uVar22) {
        __assert_fail("Vec_FltSize(p->vLoads2) == k",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/scl/sclSize.h"
                      ,0x136,"void Abc_SclLoadRestore(SC_Man *, Abc_Obj_t *)");
      }
      iVar3 = vEvals->nSize;
      if ((long)iVar3 < 1) {
        uVar19 = 0;
        fVar24 = 0.0;
      }
      else {
        pVVar9 = p->pNtk->vObjs;
        fVar24 = 0.0;
        lVar20 = 0;
        uVar19 = 0;
        do {
          iVar5 = vEvals->pArray[lVar20];
          if (((long)iVar5 < 0) || (pVVar9->nSize <= iVar5)) goto LAB_00431e81;
          pvVar8 = pVVar9->pArray[iVar5];
          if (pvVar8 != (void *)0x0) {
            if ((int)uVar19 < 0) goto LAB_00431e62;
            uVar21 = p->vTimes3->nSize;
            if (((int)uVar21 <= (int)uVar19) || (uVar21 <= uVar19 + 1)) goto LAB_00431e62;
            pfVar17 = p->vTimes3->pArray;
            uVar21 = *(uint *)((long)pvVar8 + 0x10);
            fVar2 = p->pTimes[uVar21].rise;
            fVar25 = pfVar17[uVar19] - fVar2;
            if (((p->MaxDelay0 - (fVar2 + p->pDepts[uVar21].rise)) + fVar25 < 0.0) ||
               (fVar2 = p->pTimes[uVar21].fall, fVar26 = pfVar17[uVar19 + 1] - fVar2,
               (p->MaxDelay0 - (fVar2 + p->pDepts[uVar21].fall)) + fVar26 < 0.0)) goto LAB_00431b98;
            uVar19 = uVar19 + 2;
            fVar24 = fVar24 + fVar25 * 0.5 + fVar26 * 0.5;
          }
          lVar20 = lVar20 + 1;
        } while (iVar3 != lVar20);
      }
      if (p->vTimes3->nSize != uVar19) {
        __assert_fail("Vec_FltSize(p->vTimes3) == k",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/scl/sclSize.h"
                      ,0x193,"float Abc_SclEvalPerformLegal(SC_Man *, Vec_Int_t *, float)");
      }
      fVar24 = fVar24 / (float)iVar3;
      if (((fVar24 != -1.0) || (NAN(fVar24))) && (local_74 < fVar24)) {
        local_64 = pSVar23->Id;
        local_74 = fVar24;
      }
    }
LAB_00431b98:
    pSVar23 = pSVar23->pPrev;
    iVar16 = iVar16 + 1;
  } while (pSVar23 != local_70);
  pAVar18 = pObj->pNtk;
LAB_00431bac:
  iVar16 = pObj->Id;
  if ((-1 < (long)iVar16) && (iVar16 < pAVar18->vGates->nSize)) {
    pAVar18->vGates->pArray[iVar16] = local_70->Id;
    iVar16 = vNodes->nSize;
    if ((long)iVar16 < 1) {
      uVar19 = 0;
    }
    else {
      piVar12 = vNodes->pArray;
      pVVar9 = p->pNtk->vObjs;
      lVar20 = 0;
      uVar19 = 0;
      do {
        iVar3 = piVar12[lVar20];
        if (((long)iVar3 < 0) || (pVVar9->nSize <= iVar3)) goto LAB_00431e81;
        pvVar8 = pVVar9->pArray[iVar3];
        if (pvVar8 != (void *)0x0) {
          if ((int)uVar19 < 0) {
LAB_00431e62:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecFlt.h"
                          ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
          }
          uVar21 = p->vTimes2->nSize;
          if ((int)uVar21 <= (int)uVar19) goto LAB_00431e62;
          pfVar17 = p->vTimes2->pArray;
          pSVar11 = p->pTimes;
          uVar4 = *(uint *)((long)pvVar8 + 0x10);
          pSVar11[uVar4].rise = pfVar17[uVar19];
          if (uVar21 <= uVar19 + 1) goto LAB_00431e62;
          pSVar11[uVar4].fall = pfVar17[uVar19 + 1];
          if (uVar21 <= uVar19 + 2) goto LAB_00431e62;
          uVar1 = uVar19 + 3;
          pSVar11 = p->pSlews;
          pSVar11[uVar4].rise = pfVar17[uVar19 + 2];
          if (uVar21 <= uVar1) goto LAB_00431e62;
          uVar19 = uVar19 + 4;
          pSVar11[uVar4].fall = pfVar17[uVar1];
        }
        lVar20 = lVar20 + 1;
      } while (iVar16 != lVar20);
    }
    if (p->vTimes2->nSize != uVar19) {
      __assert_fail("Vec_FltSize(p->vTimes2) == k",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/scl/sclSize.h"
                    ,0x16b,"void Abc_SclConeRestore(SC_Man *, Vec_Int_t *)");
    }
    iVar16 = clock_gettime(3,&local_40);
    if (iVar16 < 0) {
      lVar20 = -1;
    }
    else {
      lVar20 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
    }
    p->timeSize = p->timeSize + lVar20 + local_48;
    if ((int)local_64 < 0) {
      iVar16 = 0;
    }
    else {
      if ((p->pLib->vCells).nSize <= (int)local_64) {
LAB_00431e81:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      iVar16 = pObj->Id;
      if (((long)iVar16 < 0) || (pVVar7 = pObj->pNtk->vGates, pVVar7->nSize <= iVar16))
      goto LAB_00431ea0;
      pSVar23 = (SC_Cell *)(p->pLib->vCells).pArray[local_64];
      pVVar7->pArray[iVar16] = pSVar23->Id;
      p->SumArea = (pSVar23->area - local_70->area) + p->SumArea;
      iVar16 = vNodes->nSize;
      if (0 < iVar16) {
        lVar20 = 0;
        do {
          iVar3 = vNodes->pArray[lVar20];
          if (((long)iVar3 < 0) || (pVVar9 = p->pNtk->vObjs, pVVar9->nSize <= iVar3))
          goto LAB_00431e81;
          ppvVar13 = pVVar9->pArray;
          plVar14 = (long *)ppvVar13[iVar3];
          if (plVar14 != (long *)0x0) {
            lVar15 = *plVar14;
            iVar16 = (int)plVar14[2];
            uVar6 = *(undefined4 *)(lVar15 + 0xd8);
            Vec_IntFillExtra((Vec_Int_t *)(lVar15 + 0xe0),iVar16 + 1,(int)ppvVar13);
            if (((long)iVar16 < 0) || (*(int *)(lVar15 + 0xe4) <= iVar16)) goto LAB_00431ea0;
            *(undefined4 *)(*(long *)(lVar15 + 0xe8) + (long)iVar16 * 4) = uVar6;
            iVar16 = vNodes->nSize;
          }
          lVar20 = lVar20 + 1;
        } while (lVar20 < iVar16);
      }
      Abc_SclUpdateLoad(p,pObj,local_70,pSVar23);
      Abc_SclTimeIncInsert(p,pObj);
      iVar16 = 1;
    }
    return iVar16;
  }
LAB_00431ea0:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                ,0x1c9,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
}

Assistant:

int Abc_SclCheckImprovement( SC_Man * p, Abc_Obj_t * pObj, Vec_Int_t * vNodes, Vec_Int_t * vEvals, int Notches, int DelayGap )
{
    Abc_Obj_t * pTemp;
    SC_Cell * pCellOld, * pCellNew;
    float dGain, dGainBest;
    int i, k, gateBest;
    abctime clk;
clk = Abc_Clock();
//    printf( "%d -> %d\n", Vec_IntSize(vNodes), Vec_IntSize(vEvals) );
    // save old gate, timing, fanin load
    pCellOld = Abc_SclObjCell( pObj );
    Abc_SclConeStore( p, vNodes );
    Abc_SclEvalStore( p, vEvals );
    Abc_SclLoadStore( p, pObj );
    // try different gate sizes for this node
    gateBest = -1;
    dGainBest = -DelayGap;
    SC_RingForEachCellRev( pCellOld, pCellNew, i )
    {
        if ( pCellNew->area >= pCellOld->area )
            continue;
        if ( i > Notches )
            break;
        // set new cell
        Abc_SclObjSetCell( pObj, pCellNew );
        Abc_SclUpdateLoad( p, pObj, pCellOld, pCellNew );
        // recompute timing
        Abc_SclTimeCone( p, vNodes );
        // set old cell
        Abc_SclObjSetCell( pObj, pCellOld );
        Abc_SclLoadRestore( p, pObj );
        // evaluate gain
        dGain = Abc_SclEvalPerformLegal( p, vEvals, p->MaxDelay0 );
        if ( dGain == -1 )
            continue;
        // save best gain
        if ( dGainBest < dGain )
        {
            dGainBest = dGain;
            gateBest = pCellNew->Id;
        }
    } 
    // put back old cell and timing
    Abc_SclObjSetCell( pObj, pCellOld );
    Abc_SclConeRestore( p, vNodes );
p->timeSize += Abc_Clock() - clk;
    if ( gateBest >= 0 )
    {
        pCellNew = SC_LibCell( p->pLib, gateBest );
        Abc_SclObjSetCell( pObj, pCellNew );
        p->SumArea += pCellNew->area - pCellOld->area;
//        printf( "%f   %f -> %f\n", pCellNew->area - pCellOld->area, p->SumArea - (pCellNew->area - pCellOld->area), p->SumArea );
//        printf( "%6d  %20s -> %20s  %f -> %f\n", Abc_ObjId(pObj), pCellOld->pName, pCellNew->pName, pCellOld->area, pCellNew->area );
        // mark used nodes with the current trav ID
        Abc_NtkForEachObjVec( vNodes, p->pNtk, pTemp, k )
            Abc_NodeSetTravIdCurrent( pTemp );
        // update load and timing...
        Abc_SclUpdateLoad( p, pObj, pCellOld, pCellNew );
        Abc_SclTimeIncInsert( p, pObj );
        return 1;
    }
    return 0;
}